

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

IssuePtr __thiscall
libcellml::Validator::ValidatorImpl::makeIssueIllegalIdentifier(ValidatorImpl *this,string *name)

{
  IssueImpl *pIVar1;
  element_type *peVar2;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  IssuePtr IVar4;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  ReferenceRule local_28;
  undefined1 local_21;
  ReferenceRule referenceRule;
  string *name_local;
  ValidatorImpl *this_local;
  IssuePtr *issue;
  
  local_21 = 0;
  _referenceRule = in_RDX;
  name_local = name;
  this_local = this;
  Issue::IssueImpl::create();
  local_28 = validateCellmlIdentifier(_referenceRule);
  peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Issue::IssueImpl::setReferenceRule(peVar2->mPimpl,XML_ID_ATTRIBUTE);
  if (local_28 == DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pIVar1 = peVar2->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "CellML identifiers must contain one or more basic Latin alphabetic characters.",
               &local_59);
    Issue::IssueImpl::setDescription(pIVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    _Var3._M_pi = extraout_RDX;
  }
  else if (local_28 == DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pIVar1 = peVar2->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "CellML identifiers must not begin with a European numeric character [0-9].",
               &local_81);
    Issue::IssueImpl::setDescription(pIVar1,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    _Var3._M_pi = extraout_RDX_00;
  }
  else {
    peVar2 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pIVar1 = peVar2->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
               &local_a9);
    Issue::IssueImpl::setDescription(pIVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    _Var3._M_pi = extraout_RDX_01;
  }
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Validator::ValidatorImpl::makeIssueIllegalIdentifier(const std::string &name) const
{
    auto issue = Issue::IssueImpl::create();
    auto referenceRule = validateCellmlIdentifier(name);
    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);

    if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_AT_LEAST_ONE_ALPHANUM) {
        // One or more alphabetic characters.
        issue->mPimpl->setDescription("CellML identifiers must contain one or more basic Latin alphabetic characters.");
    } else if (referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_BEGIN_EURO_NUM) {
        // Does not start with numeric character.
        issue->mPimpl->setDescription("CellML identifiers must not begin with a European numeric character [0-9].");
    } else { /* referenceRule == Issue::ReferenceRule::DATA_REPR_IDENTIFIER_LATIN_ALPHANUM */
        // Basic Latin alphanumeric characters and underscores.
        issue->mPimpl->setDescription("CellML identifiers must not contain any characters other than [a-zA-Z0-9_].");
    }

    return issue;
}